

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

bool __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::remove_internal
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  bool bVar1;
  node_type nVar2;
  byte bVar3;
  uint uVar4;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this_00;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_01;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_02;
  basic_node_ptr<unodb::detail::node_header> **ppbVar5;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar6;
  basic_node_ptr<unodb::detail::node_header> *child_ptr;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> local_90;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> remove_result;
  uint shared_prefix_len;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *key_prefix;
  inode<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_58;
  node_type node_type;
  art_key_type remaining_key;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *pdStack_48;
  tree_depth_type depth;
  node_ptr *node;
  leaf_reclaimable_ptr r;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *root_leaf;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  art_key_type k_local;
  
  this_local = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)k.field_0;
  bVar1 = detail::basic_node_ptr<unodb::detail::node_header>::operator==(&this->root,(nullptr_t)0x0)
  ;
  if (bVar1) {
    k_local.field_0.key_bytes._M_elems[7] = 0;
  }
  else {
    nVar2 = detail::basic_node_ptr<unodb::detail::node_header>::type(&this->root);
    if (nVar2 == LEAF) {
      this_00 = detail::basic_node_ptr<unodb::detail::node_header>::
                ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                          (&this->root);
      r._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
      ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)this_local;
      bVar1 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::matches
                        (this_00,(art_key_type)this_local);
      if (bVar1) {
        detail::
        basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
        ::reclaim_leaf_on_scope_exit
                  ((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                    *)&node,this_00,this);
        detail::basic_node_ptr<unodb::detail::node_header>::operator=(&this->root,(nullptr_t)0x0);
        k_local.field_0.key_bytes._M_elems[7] = 1;
        std::
        unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&node);
      }
      else {
        k_local.field_0.key_bytes._M_elems[7] = 0;
      }
    }
    else {
      pdStack_48 = this;
      detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::tree_depth
                ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                 ((long)&remaining_key.field_0 + 4),0);
      aStack_58 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this_local;
      while( true ) {
        nVar2 = detail::basic_node_ptr<unodb::detail::node_header>::type(&pdStack_48->root);
        if (nVar2 == LEAF) {
          __assert_fail("node_type != node_type::LEAF",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3f9,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        this_01 = &detail::basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                             (&pdStack_48->root)->
                   super_inode_base<unsigned_long,_std::span<const_std::byte>_>;
        this_02 = detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::get_key_prefix(this_01);
        bVar3 = detail::
                key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                          *)&this_02->f);
        remove_result.
        super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
        _8_8_ = aStack_58;
        uVar4 = detail::
                key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                     *)&this_02->f,
                                    (basic_art_key<unsigned_long>)aStack_58.key_bytes._M_elems);
        if (uVar4 < bVar3) break;
        if (uVar4 != bVar3) {
          __assert_fail("shared_prefix_len == key_prefix_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x401,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::remove_internal(art_key_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator+=
                  ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                   ((long)&remaining_key.field_0 + 4),(uint)bVar3);
        detail::basic_art_key<unsigned_long>::shift_right
                  ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffa8,(ulong)bVar3);
        child_ptr._7_1_ =
             detail::basic_art_key<unsigned_long>::operator[]
                       ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffa8,0);
        oVar6 = detail::
                basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                ::
                remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<unsigned_long>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                          ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                            *)this_01,nVar2,(byte *)((long)&child_ptr + 7),
                           (basic_art_key<unsigned_long> *)&this_local,this,
                           (basic_node_ptr<unodb::detail::node_header> **)&stack0xffffffffffffffb8);
        local_90 = oVar6.
                   super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
                   ._M_payload;
        remove_result.
        super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
        _M_payload._0_1_ =
             oVar6.
             super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
             ._M_engaged;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_90);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          k_local.field_0.key_bytes._M_elems[7] = 0;
          goto LAB_0015a220;
        }
        ppbVar5 = std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>::
                  operator*((optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> *
                            )&local_90);
        pdStack_48 = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                     *ppbVar5;
        if (pdStack_48 ==
            (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
          k_local.field_0.key_bytes._M_elems[7] = 1;
          goto LAB_0015a220;
        }
        detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>_>::operator++
                  ((tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)
                   ((long)&remaining_key.field_0 + 4));
        detail::basic_art_key<unsigned_long>::shift_right
                  ((basic_art_key<unsigned_long> *)&stack0xffffffffffffffa8,1);
      }
      k_local.field_0.key_bytes._M_elems[7] = 0;
    }
  }
LAB_0015a220:
  return (bool)(k_local.field_0.key_bytes._M_elems[7] & 1);
}

Assistant:

bool db<Key, Value>::remove_internal(art_key_type k) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return false;

  if (root.type() == node_type::LEAF) {
    auto* const root_leaf{root.ptr<leaf_type*>()};
    if (root_leaf->matches(k)) {
      const auto r{art_policy::reclaim_leaf_on_scope_exit(root_leaf, *this)};
      root = nullptr;
      return true;
    }
    return false;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) return false;

    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto remove_result{inode->template remove_or_choose_subtree<
        std::optional<detail::node_ptr*>>(node_type, remaining_key[0], k, *this,
                                          node)};
    if (UNODB_DETAIL_UNLIKELY(!remove_result)) return false;

    auto* const child_ptr{*remove_result};
    if (child_ptr == nullptr) return true;

    node = child_ptr;
    ++depth;
    remaining_key.shift_right(1);
  }
}